

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::dropEvent(QAbstractItemView *this,QDropEvent *event)

{
  DragDropMode DVar1;
  DropAction DVar2;
  QAbstractItemViewPrivate *pQVar3;
  long lVar4;
  ulong uVar5;
  QMimeData *pQVar6;
  socklen_t *__addr_len;
  sockaddr *__addr;
  QDropEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  DropAction action;
  QAbstractItemViewPrivate *d;
  int row;
  int col;
  QModelIndex index;
  undefined4 in_stack_ffffffffffffff88;
  DropAction in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  DropAction in_stack_ffffffffffffff94;
  QAbstractItemView *in_stack_ffffffffffffff98;
  QAbstractItemModel *pQVar7;
  DropAction local_60;
  bool local_59;
  undefined4 local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QFlagsStorageHelper<Qt::DropAction,_4> local_10;
  QFlagsStorageHelper<Qt::DropAction,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractItemView *)0x806d8f);
  DVar1 = dragDropMode(in_stack_ffffffffffffff98);
  if (DVar1 == InternalMove) {
    lVar4 = QDropEvent::source();
    local_59 = true;
    if (lVar4 == in_RDI) {
      local_10.super_QFlagsStorage<Qt::DropAction>.i =
           (QFlagsStorage<Qt::DropAction>)
           QDropEvent::possibleActions
                     ((QDropEvent *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_c.super_QFlagsStorage<Qt::DropAction>.i =
           (QFlagsStorage<Qt::DropAction>)
           QFlags<Qt::DropAction>::operator&
                     ((QFlags<Qt::DropAction> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
      local_59 = QFlags<Qt::DropAction>::operator!((QFlags<Qt::DropAction> *)&local_c);
    }
    if (local_59 != false) goto LAB_00806f48;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x806e2e);
  local_2c = 0xffffffff;
  local_30 = 0xffffffff;
  uVar5 = (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate + 0x110))
                    (pQVar3,in_RSI,&local_30,&local_2c,&local_28);
  if ((uVar5 & 1) != 0) {
    DVar1 = dragDropMode(in_stack_ffffffffffffff98);
    if (DVar1 == InternalMove) {
      local_60 = MoveAction;
    }
    else {
      local_60 = QDropEvent::dropAction(in_RSI);
    }
    pQVar7 = pQVar3->model;
    pQVar6 = QDropEvent::mimeData(in_RSI);
    uVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))
                      (pQVar7,pQVar6,local_60,local_30,local_2c,&local_28);
    if ((uVar5 & 1) != 0) {
      in_stack_ffffffffffffff94 = local_60;
      DVar2 = QDropEvent::dropAction(in_RSI);
      __addr_len = (socklen_t *)(ulong)DVar2;
      if (in_stack_ffffffffffffff94 == DVar2) {
        QDropEvent::acceptProposedAction((QDropEvent *)0x806f1d);
      }
      else {
        QDropEvent::setDropAction((DropAction)in_RSI);
        QEvent::accept((QEvent *)in_RSI,local_60,__addr,__addr_len);
      }
    }
  }
  stopAutoScroll((QAbstractItemView *)0x806f2b);
  setState((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
           in_stack_ffffffffffffff8c);
  QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
LAB_00806f48:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::dropEvent(QDropEvent *event)
{
    Q_D(QAbstractItemView);
    if (dragDropMode() == InternalMove) {
        if (event->source() != this || !(event->possibleActions() & Qt::MoveAction))
            return;
    }

    QModelIndex index;
    int col = -1;
    int row = -1;
    if (d->dropOn(event, &row, &col, &index)) {
        const Qt::DropAction action = dragDropMode() == InternalMove ? Qt::MoveAction : event->dropAction();
        if (d->model->dropMimeData(event->mimeData(), action, row, col, index)) {
            if (action != event->dropAction()) {
                event->setDropAction(action);
                event->accept();
            } else {
                event->acceptProposedAction();
            }
        }
    }
    stopAutoScroll();
    setState(NoState);
    d->viewport->update();
}